

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O3

void ARGBAffineRow_SSE2(uint8_t *src_argb,int src_argb_stride,uint8_t *dst_argb,float *src_dudv,
                       int width)

{
  bool bVar1;
  float fVar2;
  float fVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  float fVar7;
  float fVar10;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar11 [16];
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  undefined1 auVar22 [16];
  float fVar23;
  float fVar24;
  int width_local;
  
  fVar12 = *src_dudv;
  fVar13 = src_dudv[1];
  fVar7 = 0.0;
  fVar10 = 0.0;
  fVar2 = src_dudv[2];
  fVar3 = src_dudv[3];
  uVar4 = (long)src_argb_stride * 0x10000 + 4;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = uVar4;
  iVar5 = width + -4;
  fVar23 = 0.0;
  fVar24 = 0.0;
  if (3 < width) {
    auVar22._0_4_ = (undefined4)uVar4;
    auVar22._4_4_ = auVar22._0_4_;
    auVar22._8_4_ = auVar22._0_4_;
    auVar22._12_4_ = auVar22._0_4_;
    fVar7 = fVar12 + fVar2;
    fVar10 = fVar13 + fVar3;
    fVar18 = fVar2 + fVar2;
    fVar19 = fVar3 + fVar3;
    fVar20 = fVar2 + fVar2;
    fVar21 = fVar3 + fVar3;
    fVar14 = fVar12 + fVar18;
    fVar15 = fVar13 + fVar19;
    fVar16 = fVar7 + fVar20;
    fVar17 = fVar10 + fVar21;
    iVar6 = iVar5;
    do {
      auVar8._0_4_ = (int)fVar12;
      auVar8._4_4_ = (int)fVar13;
      auVar8._8_4_ = (int)fVar7;
      auVar8._12_4_ = (int)fVar10;
      auVar11._0_4_ = (int)fVar14;
      auVar11._4_4_ = (int)fVar15;
      auVar11._8_4_ = (int)fVar16;
      auVar11._12_4_ = (int)fVar17;
      auVar8 = packssdw(auVar8,auVar11);
      auVar8 = pmaddwd(auVar8,auVar22);
      fVar12 = fVar12 + fVar18 + fVar18;
      fVar13 = fVar13 + fVar19 + fVar19;
      fVar7 = fVar7 + fVar20 + fVar20;
      fVar10 = fVar10 + fVar21 + fVar21;
      *(ulong *)dst_argb =
           CONCAT44(*(undefined4 *)(src_argb + auVar8._4_4_),
                    *(undefined4 *)(src_argb + auVar8._0_4_));
      fVar14 = fVar14 + fVar18 + fVar18;
      fVar15 = fVar15 + fVar19 + fVar19;
      fVar16 = fVar16 + fVar20 + fVar20;
      fVar17 = fVar17 + fVar21 + fVar21;
      *(ulong *)(dst_argb + 8) =
           CONCAT44(*(undefined4 *)(src_argb + auVar8._12_4_),
                    *(undefined4 *)(src_argb + auVar8._8_4_));
      dst_argb = dst_argb + 0x10;
      iVar5 = iVar6 + -4;
      bVar1 = 3 < iVar6;
      iVar6 = iVar5;
      fVar23 = fVar2;
      fVar24 = fVar3;
    } while (bVar1);
  }
  iVar6 = iVar5 + 3;
  if (SCARRY4(iVar5,3) == iVar5 + 3 < 0) {
    do {
      auVar9._0_4_ = (int)fVar12;
      auVar9._4_4_ = (int)fVar13;
      auVar9._8_4_ = (int)fVar7;
      auVar9._12_4_ = (int)fVar10;
      auVar8 = packssdw(auVar9,auVar9);
      auVar8 = pmaddwd(auVar8,auVar22);
      fVar12 = fVar12 + fVar2;
      fVar13 = fVar13 + fVar3;
      fVar7 = fVar7 + fVar23;
      fVar10 = fVar10 + fVar24;
      *(undefined4 *)dst_argb = *(undefined4 *)(src_argb + auVar8._0_4_);
      dst_argb = dst_argb + 4;
      bVar1 = 0 < iVar6;
      iVar6 = iVar6 + -1;
    } while (bVar1);
  }
  return;
}

Assistant:

LIBYUV_API
void ARGBAffineRow_SSE2(const uint8_t* src_argb,
                        int src_argb_stride,
                        uint8_t* dst_argb,
                        const float* src_dudv,
                        int width) {
  intptr_t src_argb_stride_temp = src_argb_stride;
  intptr_t temp;
  asm volatile(
      "movq        (%3),%%xmm2                   \n"
      "movq        0x08(%3),%%xmm7               \n"
      "shl         $0x10,%1                      \n"
      "add         $0x4,%1                       \n"
      "movd        %1,%%xmm5                     \n"
      "sub         $0x4,%4                       \n"
      "jl          49f                           \n"

      "pshufd      $0x44,%%xmm7,%%xmm7           \n"
      "pshufd      $0x0,%%xmm5,%%xmm5            \n"
      "movdqa      %%xmm2,%%xmm0                 \n"
      "addps       %%xmm7,%%xmm0                 \n"
      "movlhps     %%xmm0,%%xmm2                 \n"
      "movdqa      %%xmm7,%%xmm4                 \n"
      "addps       %%xmm4,%%xmm4                 \n"
      "movdqa      %%xmm2,%%xmm3                 \n"
      "addps       %%xmm4,%%xmm3                 \n"
      "addps       %%xmm4,%%xmm4                 \n"

      // 4 pixel loop
      LABELALIGN
      "40:                                       \n"
      "cvttps2dq   %%xmm2,%%xmm0                 \n"  // x,y float->int first 2
      "cvttps2dq   %%xmm3,%%xmm1                 \n"  // x,y float->int next 2
      "packssdw    %%xmm1,%%xmm0                 \n"  // x, y as 8 shorts
      "pmaddwd     %%xmm5,%%xmm0                 \n"  // off = x*4 + y*stride
      "movd        %%xmm0,%k1                    \n"
      "pshufd      $0x39,%%xmm0,%%xmm0           \n"
      "movd        %%xmm0,%k5                    \n"
      "pshufd      $0x39,%%xmm0,%%xmm0           \n"
      "movd        0x00(%0,%1,1),%%xmm1          \n"
      "movd        0x00(%0,%5,1),%%xmm6          \n"
      "punpckldq   %%xmm6,%%xmm1                 \n"
      "addps       %%xmm4,%%xmm2                 \n"
      "movq        %%xmm1,(%2)                   \n"
      "movd        %%xmm0,%k1                    \n"
      "pshufd      $0x39,%%xmm0,%%xmm0           \n"
      "movd        %%xmm0,%k5                    \n"
      "movd        0x00(%0,%1,1),%%xmm0          \n"
      "movd        0x00(%0,%5,1),%%xmm6          \n"
      "punpckldq   %%xmm6,%%xmm0                 \n"
      "addps       %%xmm4,%%xmm3                 \n"
      "movq        %%xmm0,0x08(%2)               \n"
      "lea         0x10(%2),%2                   \n"
      "sub         $0x4,%4                       \n"
      "jge         40b                           \n"

      "49:                                       \n"
      "add         $0x3,%4                       \n"
      "jl          19f                           \n"

      // 1 pixel loop
      LABELALIGN
      "10:                                       \n"
      "cvttps2dq   %%xmm2,%%xmm0                 \n"
      "packssdw    %%xmm0,%%xmm0                 \n"
      "pmaddwd     %%xmm5,%%xmm0                 \n"
      "addps       %%xmm7,%%xmm2                 \n"
      "movd        %%xmm0,%k1                    \n"
      "movd        0x00(%0,%1,1),%%xmm0          \n"
      "movd        %%xmm0,(%2)                   \n"
      "lea         0x04(%2),%2                   \n"
      "sub         $0x1,%4                       \n"
      "jge         10b                           \n"
      "19:                                       \n"
      : "+r"(src_argb),              // %0
        "+r"(src_argb_stride_temp),  // %1
        "+r"(dst_argb),              // %2
        "+r"(src_dudv),              // %3
        "+rm"(width),                // %4
        "=&r"(temp)                  // %5
      :
      : "memory", "cc", "xmm0", "xmm1", "xmm2", "xmm3", "xmm4", "xmm5", "xmm6",
        "xmm7");
}